

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_regcb<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  value_type peVar1;
  example *peVar2;
  size_type sVar3;
  reference ppeVar4;
  size_t sVar5;
  cb_class *pcVar6;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  uint64_t unaff_retaddr;
  multi_ex *in_stack_00000008;
  multi_learner *in_stack_00000010;
  float delta;
  float max_range;
  uint32_t num_actions;
  v_array<ACTION_SCORE::action_score> *preds;
  label *ld;
  size_t i;
  multi_ex *in_stack_000004f0;
  float local_4c;
  ulong local_20;
  
  peVar2 = test_adf_sequence(in_stack_000004f0);
  if (peVar2 == (example *)0x0) {
    LEARNER::multiline_learn_or_predict<false>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  }
  else {
    for (local_20 = 0; sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX),
        local_20 < sVar3 - 1; local_20 = local_20 + 1) {
      ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,local_20);
      peVar1 = *ppeVar4;
      sVar5 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&(peVar1->l).simple);
      if (sVar5 == 1) {
        pcVar6 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&(peVar1->l).simple,0);
        pcVar6->probability = 1.0;
      }
    }
    LEARNER::multiline_learn_or_predict<true>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  }
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  sVar5 = v_array<ACTION_SCORE::action_score>::size
                    ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar4)->pred).scalars);
  *(long *)(in_RDI + 0xa0) = *(long *)(in_RDI + 0xa0) + 1;
  local_4c = (float)((sVar5 & 0xffffffff) * *(long *)(in_RDI + 0xa0));
  std::log((double)(ulong)(uint)local_4c);
  std::pow<float,int>(0.0,0x317f27);
  return;
}

Assistant:

void predict_or_learn_regcb(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  if (is_learn && test_adf_sequence(examples) != nullptr)
  {
    for (size_t i = 0; i < examples.size() - 1; ++i)
    {
      CB::label& ld = examples[i]->l.cb;
      if (ld.costs.size() == 1)
        ld.costs[0].probability = 1.f;  // no importance weighting
    }

    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)preds.size();
  ++data.counter;

  const float max_range = data.max_cb_cost - data.min_cb_cost;
  // threshold on empirical loss difference
  const float delta = data.c0 * log((float)(num_actions * data.counter)) * pow(max_range, 2);

  if (!is_learn)
  {
    get_cost_ranges(data.min_costs, data.max_costs, delta, data, base, examples,
        /*min_only=*/data.regcbopt);

    if (data.regcbopt)  // optimistic variant
    {
      float min_cost = FLT_MAX;
      size_t a_opt = 0;  // optimistic action
      for (size_t a = 0; a < num_actions; ++a)
      {
        if (data.min_costs[a] < min_cost)
        {
          min_cost = data.min_costs[a];
          a_opt = a;
        }
      }
      for (size_t i = 0; i < preds.size(); ++i)
      {
        if (preds[i].action == a_opt || (!data.first_only && data.min_costs[preds[i].action] == min_cost))
          preds[i].score = 1;
        else
          preds[i].score = 0;
      }
    }
    else  // elimination variant
    {
      float min_max_cost = FLT_MAX;
      for (size_t a = 0; a < num_actions; ++a)
        if (data.max_costs[a] < min_max_cost)
          min_max_cost = data.max_costs[a];
      for (size_t i = 0; i < preds.size(); ++i)
      {
        if (data.min_costs[preds[i].action] <= min_max_cost)
          preds[i].score = 1;
        else
          preds[i].score = 0;
        // explore uniformly on support
        enforce_minimum_probability(1.0, /*update_zero_elements=*/false, begin_scores(preds), end_scores(preds));
      }
    }
  }
}